

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O1

void * __thiscall TCMalloc_PageMap2<35>::Next(TCMalloc_PageMap2<35> *this,Number k)

{
  Leaf *pLVar1;
  void *pvVar2;
  void *in_R8;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  do {
    if (0x7ffffffff < k) {
      return (void *)0x0;
    }
    pLVar1 = this->root_[k >> 0x12];
    if (pLVar1 == (Leaf *)0x0) {
LAB_0011ddbb:
      k = (k & 0x7fffc0000) + 0x40000;
      bVar5 = true;
      pvVar2 = in_R8;
    }
    else {
      uVar3 = (ulong)((uint)k & 0x3ffff);
      pvVar2 = pLVar1->values[uVar3];
      if (pvVar2 == (void *)0x0) {
        do {
          uVar4 = uVar3;
          pvVar2 = in_R8;
          if (uVar4 == 0x3ffff) break;
          pvVar2 = pLVar1->values[uVar4 + 1];
          uVar3 = uVar4 + 1;
        } while (pvVar2 == (void *)0x0);
        bVar5 = 0x3fffe < uVar4;
      }
      else {
        bVar5 = false;
      }
      in_R8 = pvVar2;
      if (bVar5) goto LAB_0011ddbb;
      bVar5 = false;
    }
    in_R8 = pvVar2;
    if (!bVar5) {
      return pvVar2;
    }
  } while( true );
}

Assistant:

void* Next(Number k) const {
    while (k < (Number(1) << BITS)) {
      const Number i1 = k >> LEAF_BITS;
      Leaf* leaf = root_[i1];
      if (leaf != nullptr) {
        // Scan forward in leaf
        for (Number i2 = k & (LEAF_LENGTH - 1); i2 < LEAF_LENGTH; i2++) {
          if (leaf->values[i2] != nullptr) {
            return leaf->values[i2];
          }
        }
      }
      // Skip to next top-level entry
      k = (i1 + 1) << LEAF_BITS;
    }
    return nullptr;
  }